

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Finite * __thiscall Matrix<Finite>::det(Finite *__return_storage_ptr__,Matrix<Finite> *this)

{
  uint uVar1;
  matrix_error *this_00;
  uint uVar2;
  Matrix<Finite> tmp;
  
  if (this->N == this->M) {
    Matrix(&tmp,this);
    uVar1 = gauss(&tmp,(Matrix<Finite> *)0x0);
    if (uVar1 == this->N) {
      Finite::Finite(__return_storage_ptr__,1);
      uVar1 = this->N;
      for (uVar2 = 0; uVar2 < uVar1 * uVar1; uVar2 = uVar2 + uVar1 + 1) {
        Finite::operator*=(__return_storage_ptr__,tmp.arr + uVar2);
        uVar1 = this->N;
      }
    }
    else {
      Finite::Finite(__return_storage_ptr__);
    }
    ~Matrix(&tmp);
    return __return_storage_ptr__;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to calculate determinant of a non-square matrix");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Field Matrix<Field>::det() const
{
    if(N != M)
        throw matrix_error("Trying to calculate determinant of a non-square matrix");
    Matrix tmp(*this);
    if(tmp.gauss() != N)
        return Field();
    Field ans = 1;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans *= tmp.arr[i];
    }
    return ans;
}